

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

bool __thiscall
wasm::ValidationInfo::shouldBeSubTypeIgnoringShared
          (ValidationInfo *this,Type left,Type right,Expression *curr,char *text,Function *func)

{
  bool bVar1;
  BasicHeapType id;
  Nullability nullable;
  Shareability local_8c;
  bool local_79;
  HeapType local_68;
  Type local_60;
  Type matchedRight;
  HeapType ht;
  HeapType HStack_40;
  Shareability share;
  Function *local_38;
  Function *func_local;
  char *text_local;
  Expression *curr_local;
  ValidationInfo *this_local;
  Type right_local;
  Type left_local;
  
  local_38 = func;
  func_local = (Function *)text;
  text_local = (char *)curr;
  curr_local = (Expression *)this;
  this_local = (ValidationInfo *)right.id;
  right_local = left;
  bVar1 = wasm::Type::isRef((Type *)&this_local);
  local_79 = false;
  if (bVar1) {
    HStack_40 = wasm::Type::getHeapType((Type *)&this_local);
    local_79 = HeapType::isBasic(&stack0xffffffffffffffc0);
  }
  if (local_79 != false) {
    bVar1 = wasm::Type::isRef(&right_local);
    if (bVar1) {
      ht = wasm::Type::getHeapType(&right_local);
      local_8c = HeapType::getShared(&ht);
    }
    else {
      local_8c = Unshared;
    }
    matchedRight.id = (uintptr_t)wasm::Type::getHeapType((Type *)&this_local);
    id = HeapType::getBasic((HeapType *)&matchedRight,local_8c);
    HeapType::HeapType(&local_68,id);
    nullable = wasm::Type::getNullability((Type *)&this_local);
    wasm::Type::Type(&local_60,local_68,nullable,Inexact);
    bVar1 = shouldBeSubType(this,right_local,local_60,(Expression *)text_local,(char *)func_local,
                            local_38);
    return bVar1;
  }
  __assert_fail("right.isRef() && right.getHeapType().isBasic()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-validator.cpp"
                ,0xe5,
                "bool wasm::ValidationInfo::shouldBeSubTypeIgnoringShared(Type, Type, Expression *, const char *, Function *)"
               );
}

Assistant:

bool shouldBeSubTypeIgnoringShared(Type left,
                                     Type right,
                                     Expression* curr,
                                     const char* text,
                                     Function* func = nullptr) {
    assert(right.isRef() && right.getHeapType().isBasic());
    auto share = left.isRef() ? left.getHeapType().getShared() : Unshared;
    auto ht = right.getHeapType();
    auto matchedRight = Type(ht.getBasic(share), right.getNullability());
    return shouldBeSubType(left, matchedRight, curr, text, func);
  }